

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O1

bool MeCab::Viterbi::buildAllLattice(Lattice *lattice)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  bool bVar7;
  undefined4 extraout_var;
  
  iVar3 = (*lattice->_vptr_Lattice[0x12])(lattice,0x20);
  if ((char)iVar3 != '\0') {
    iVar3 = (*lattice->_vptr_Lattice[2])(lattice);
    plVar5 = (long *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
    iVar4 = (*lattice->_vptr_Lattice[4])(lattice);
    if (-1 < extraout_var_00) {
      lVar6 = 0;
      do {
        plVar2 = *(long **)(CONCAT44(extraout_var_01,iVar4) + lVar6 * 8);
        while (plVar1 = plVar2, plVar1 != (long *)0x0) {
          plVar5[1] = (long)plVar1;
          *plVar1 = (long)plVar5;
          plVar5 = plVar1;
          plVar2 = (long *)plVar1[3];
        }
        bVar7 = lVar6 != CONCAT44(extraout_var_00,iVar3);
        lVar6 = lVar6 + 1;
      } while (bVar7);
    }
  }
  return true;
}

Assistant:

bool Viterbi::buildAllLattice(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_ALL_MORPHS)) {
    return true;
  }

  Node *prev = lattice->bos_node();
  const size_t len = lattice->size();
  Node **begin_node_list = lattice->begin_nodes();

  for (long pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      prev->next = node;
      node->prev = prev;
      prev = node;
    }
  }

  return true;
}